

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessParameters *params)

{
  QObjectData *pQVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  pointer __old_p;
  _func_int **pp_Var5;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pp_Var5 = pQVar1[8]._vptr_QObjectData;
  if (pp_Var5 == (_func_int **)0x0) {
    pp_Var5 = (_func_int **)operator_new(0x40);
    *pp_Var5 = (_func_int *)0x0;
    pp_Var5[1] = (_func_int *)0x0;
    pp_Var5[2] = (_func_int *)0x0;
    pp_Var5[3] = (_func_int *)0x0;
    pp_Var5[4] = (_func_int *)0x0;
    pp_Var5[5] = (_func_int *)0x0;
    pp_Var5[6] = (_func_int *)0x0;
    pp_Var5[7] = (_func_int *)0x0;
    pQVar1[8]._vptr_QObjectData = pp_Var5;
  }
  p_Var2 = *(_func_int **)params;
  p_Var3 = *(_func_int **)params->_reserved;
  p_Var4 = *(_func_int **)(params->_reserved + 4);
  pp_Var5[6] = *(_func_int **)(params->_reserved + 2);
  pp_Var5[7] = p_Var4;
  pp_Var5[4] = p_Var2;
  pp_Var5[5] = p_Var3;
  return;
}

Assistant:

void QProcess::setUnixProcessParameters(const UnixProcessParameters &params)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = params;
}